

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O3

void easm_del_sinsn(easm_sinsn *sinsn)

{
  long lVar1;
  
  if (sinsn != (easm_sinsn *)0x0) {
    if (0 < sinsn->operandsnum) {
      lVar1 = 0;
      do {
        easm_del_operand(sinsn->operands[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < sinsn->operandsnum);
    }
    free(sinsn->operands);
    free(sinsn->str);
    easm_del_mods(sinsn->mods);
    free(sinsn);
    return;
  }
  return;
}

Assistant:

void easm_del_sinsn(struct easm_sinsn *sinsn) {
	if (!sinsn) return;
	int i;
	for (i = 0; i < sinsn->operandsnum; i++)
		easm_del_operand(sinsn->operands[i]);
	free(sinsn->operands);
	free(sinsn->str);
	easm_del_mods(sinsn->mods);
	free(sinsn);
}